

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaB_print(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  char *__ptr;
  uint idx;
  size_t l;
  
  l = in_RAX;
  iVar1 = lua_gettop(L);
  lua_getglobal(L,"tostring");
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  idx = 1;
  while( true ) {
    if (idx - iVar1 == 1) {
      fputc(10,_stdout);
      fflush(_stdout);
      return 0;
    }
    lua_pushvalue(L,-1);
    lua_pushvalue(L,idx);
    lua_callk(L,1,1,0,(lua_CFunction)0x0);
    __ptr = lua_tolstring(L,-1,&l);
    if (__ptr == (char *)0x0) break;
    if (1 < idx) {
      fputc(9,_stdout);
    }
    fwrite(__ptr,1,l,_stdout);
    lua_settop(L,-2);
    idx = idx + 1;
  }
  iVar1 = luaL_error(L,"\'tostring\' must return a string to \'print\'");
  return iVar1;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  lua_getglobal(L, "tostring");
  for (i=1; i<=n; i++) {
    const char *s;
    size_t l;
    lua_pushvalue(L, -1);  /* function to be called */
    lua_pushvalue(L, i);   /* value to print */
    lua_call(L, 1, 1);
    s = lua_tolstring(L, -1, &l);  /* get result */
    if (s == NULL)
      return luaL_error(L,
         LUA_QL("tostring") " must return a string to " LUA_QL("print"));
    if (i>1) luai_writestring("\t", 1);
    luai_writestring(s, l);
    lua_pop(L, 1);  /* pop result */
  }
  luai_writeline();
  return 0;
}